

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall helics::CommonCore::getAddress_abi_cxx11_(CommonCore *this)

{
  bool bVar1;
  BrokerState BVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  undefined1 local_28 [40];
  
  BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x48b78c);
  if ((BVar2 != CONNECTED) ||
     (bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x48b7a7),
     bVar1)) {
    (**(code **)(in_RDI->_M_string_length + 0x38))(local_28,&in_RDI->_M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_00000020,in_stack_00000018);
    std::__cxx11::string::~string(in_RDI);
  }
  return (string *)&in_RDI[5].field_2;
}

Assistant:

const std::string& CommonCore::getAddress() const
{
    if ((getBrokerState() != BrokerState::CONNECTED) || (address.empty())) {
        address = generateLocalAddressString();
    }
    return address;
}